

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O1

future<int> __thiscall prometheus::Gateway::AsyncDelete(Gateway *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Result<int> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined8 in_RSI;
  _State_baseV2 *__tmp;
  bool bVar5;
  future<int> fVar6;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  __state_type local_58;
  long *local_48;
  _func_int **local_40 [2];
  
  local_58.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_58.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00125710;
  peVar1 = (element_type *)(p_Var2 + 1);
  p_Var2[2]._M_use_count = 0;
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var2[1]._M_weak_count + 1) = 0;
  p_Var2[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[3]._M_use_count = 0;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00125760;
  p_Var3 = (_Result<int> *)operator_new(0x18);
  ::std::__future_base::_Result<int>::_Result(p_Var3);
  p_Var2[4]._vptr__Sp_counted_base = (_func_int **)p_Var3;
  p_Var2[4]._M_use_count = (int)in_RSI;
  p_Var2[4]._M_weak_count = (int)((ulong)in_RSI >> 0x20);
  local_40[0] = (_func_int **)0x0;
  local_48 = (long *)operator_new(0x20);
  *local_48 = (long)&PTR___State_001257b8;
  local_48[1] = (long)peVar1;
  local_48[2] = (long)::std::__future_base::
                      _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/push/src/gateway.cc:194:41)>_>,_int>
                      ::_M_run;
  local_48[3] = 0;
  ::std::thread::_M_start_thread(local_40,&local_48,0);
  if (local_48 != (long *)0x0) {
    (**(code **)(*local_48 + 8))();
  }
  _Var4._M_pi = local_58.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (p_Var2[3]._vptr__Sp_counted_base == (_func_int **)0x0) {
    p_Var2[3]._vptr__Sp_counted_base = local_40[0];
    bVar5 = local_58.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar1;
    local_58.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var2;
    if (bVar5) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
    }
    if (local_58.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
      p_Var2->_M_use_count = 1;
      p_Var2->_M_weak_count = 1;
      p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001257f8;
      p_Var2[2]._M_use_count = 0;
      p_Var2[1]._M_use_count = 0;
      p_Var2[1]._M_weak_count = 0;
      *(undefined8 *)((long)&p_Var2[1]._M_weak_count + 1) = 0;
      p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00125848;
      p_Var3 = (_Result<int> *)operator_new(0x18);
      ::std::__future_base::_Result<int>::_Result(p_Var3);
      _Var4._M_pi = local_58.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      p_Var2[3]._vptr__Sp_counted_base = (_func_int **)p_Var3;
      p_Var2[3]._M_use_count = (int)in_RSI;
      p_Var2[3]._M_weak_count = (int)((ulong)in_RSI >> 0x20);
      bVar5 = local_58.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_58.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)(p_Var2 + 1);
      local_58.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var2;
      if (bVar5) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
      }
    }
    ::std::__basic_future<int>::__basic_future((__basic_future<int> *)this,&local_58);
    _Var4._M_pi = extraout_RDX;
    if (local_58.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var4._M_pi = extraout_RDX_00;
    }
    fVar6.super___basic_future<int>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var4._M_pi;
    fVar6.super___basic_future<int>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (future<int>)
           fVar6.super___basic_future<int>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
  }
  ::std::terminate();
}

Assistant:

std::future<int> Gateway::AsyncDelete() {
  return std::async(std::launch::async, [&] { return Delete(); });
}